

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall
QTableModel::setItemData(QTableModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  _Rb_tree_color _Var2;
  char cVar3;
  bool bVar4;
  QTableWidget *this_00;
  QTableWidgetItem *pQVar5;
  _Base_ptr p_Var6;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar7;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  long in_FS_OFFSET;
  QList<int> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  if (((-1 < index->r) && (bVar4 = false, -1 < index->c)) &&
     (bVar4 = false, (index->m).ptr != (QAbstractItemModel *)0x0)) {
    this_00 = (QTableWidget *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
    pQVar5 = item(this,index);
    if (pQVar5 == (QTableWidgetItem *)0x0) {
      if (this_00 == (QTableWidget *)0x0) {
        bVar4 = false;
        goto LAB_0059e344;
      }
      pQVar5 = createItem(this);
      pQVar7 = (roles->d).d.ptr;
      if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        pQVar7 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)0x0;
      }
      else {
        pQVar7 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar1 = (roles->d).d.ptr;
      pQVar8 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                *)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header;
      if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        pQVar8 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)0x0;
      }
      if (pQVar7 != pQVar8) {
        do {
          (*pQVar5->_vptr_QTableWidgetItem[4])
                    (pQVar5,(ulong)*(uint *)&(pQVar7->m)._M_t._M_impl.super__Rb_tree_header.
                                             _M_header._M_left,
                     &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
          pQVar7 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                    *)std::_Rb_tree_increment((_Rb_tree_node_base *)pQVar7);
          pQVar8 = (roles->d).d.ptr;
          if (pQVar8 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            pQVar8 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)&(pQVar8->m)._M_t._M_impl.super__Rb_tree_header;
          }
        } while (pQVar7 != pQVar8);
      }
      QTableWidget::setItem(this_00,index->r,index->c,pQVar5);
    }
    else {
      p_Var6 = (_Base_ptr)0x0;
      pQVar5->view = (QTableWidget *)0x0;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (int *)0x0;
      local_78.d.size = 0;
      pQVar7 = (roles->d).d.ptr;
      if (pQVar7 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var6 = (pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar7 = (roles->d).d.ptr;
      p_Var9 = &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var9 = (_Base_ptr)0x0;
      }
      if (p_Var6 != p_Var9) {
        do {
          _Var2 = p_Var6[1]._M_color;
          if (p_Var6[1]._M_color == 2) {
            _Var2 = _S_red;
          }
          (*pQVar5->_vptr_QTableWidgetItem[3])(&local_58,pQVar5,(ulong)_Var2);
          cVar3 = ::QVariant::equals((QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
          if (cVar3 == '\0') {
            (*pQVar5->_vptr_QTableWidgetItem[4])(pQVar5,(ulong)_Var2,&p_Var6[1]._M_parent);
            local_58._0_4_ = _Var2;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)local_58.data);
            QList<int>::end(&local_78);
            if (_Var2 == _S_red) {
              local_58._0_4_ = 2;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)local_58.data);
              QList<int>::end(&local_78);
            }
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          pQVar7 = (roles->d).d.ptr;
          p_Var10 = &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (pQVar7 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                         *)0x0) {
            p_Var10 = (_Rb_tree_node_base *)0x0;
          }
        } while (p_Var6 != p_Var10);
      }
      pQVar5->view = this_00;
      if (local_78.d.size != 0) {
        itemChanged(this,pQVar5,&local_78);
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
    bVar4 = true;
  }
LAB_0059e344:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;

    QTableWidget *view = this->view();
    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->view = nullptr; // prohibits item from calling itemChanged()
        QList<int> rolesVec;
        for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it) {
            const int role = (it.key() == Qt::EditRole ? Qt::DisplayRole : it.key());
            if (itm->data(role) != it.value()) {
                itm->setData(role, it.value());
                rolesVec += role;
                if (role == Qt::DisplayRole)
                    rolesVec += Qt::EditRole;
            }
        }
        itm->view = view;
        if (!rolesVec.isEmpty())
            itemChanged(itm, rolesVec);
        return true;
    }

    if (!view)
        return false;

    itm = createItem();
    for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it)
        itm->setData(it.key(), it.value());
    view->setItem(index.row(), index.column(), itm);
    return true;
}